

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Granulator.cpp
# Opt level: O3

int Granulator::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  int iVar1;
  float *pfVar2;
  long lVar3;
  long *plVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  float fVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  float *src;
  uint uVar17;
  float fVar18;
  ulong uVar19;
  long lVar20;
  bool bVar21;
  float fVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  uint uVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  double dVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  MutexScopeLock mutexScope;
  MutexScopeLock local_38;
  
  pfVar2 = (float *)(state->field_0).field_0.effectdata;
  if (pfVar2 == (float *)0x0) {
    __assert_fail("effectdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfd,
                  "T *UnityAudioEffectState::GetEffectData() const [T = Granulator::EffectData]");
  }
  if ((state->field_0).field_0.internal != (void *)0x0) {
    uVar14 = (uint)pfVar2[0xc];
    local_38.mutex = (Mutex *)0x0;
    if ((int)uVar14 >= 0) {
      local_38.mutex = (Mutex *)sampleMutex;
    }
    fVar27 = (float)(int)(state->field_0).field_0.samplerate;
    fVar22 = pfVar2[5];
    if ((int)uVar14 < 0) {
      pfVar25 = pfVar2 + 0x13b4;
      pfVar2[0x13b9] = (float)inchannels;
    }
    else {
      Mutex::Lock((Mutex *)sampleMutex);
      pfVar2[0x13b9] = (float)inchannels;
      if (GetGranulatorSample(int)::initialized == '\0') {
        memset(GetGranulatorSample(int)::samples,0,0x4280);
        GetGranulatorSample(int)::initialized = '\x01';
      }
      pfVar25 = (float *)(GetGranulatorSample(int)::samples + (ulong)uVar14 * 0x428);
    }
    if (length != 0) {
      uVar15 = (ulong)(uint)inchannels;
      uVar17 = 0;
      do {
        if (0 < inchannels) {
          uVar19 = 0;
          bVar9 = false;
          do {
            bVar21 = bVar9;
            uVar26 = -(uint)(pfVar2[uVar19 + 0xf] < ABS(inbuffer[uVar19]) + 1e-11);
            fVar18 = (float)(~uVar26 & (uint)(pfVar2[uVar19 + 0xf] * 0.9995) |
                            (uint)(ABS(inbuffer[uVar19]) + 1e-11) & uVar26);
            bVar5 = fVar22 + fVar22 < fVar18;
            pfVar2[uVar19 + 0xf] = fVar18;
            uVar19 = uVar19 + 1;
            bVar9 = (bool)(bVar21 | bVar5);
          } while (uVar15 != uVar19);
          if (bVar21 || bVar5) {
            fVar18 = (float)((int)pfVar2[0xe] - 1U & 0x3ffff);
            pfVar2[0xe] = fVar18;
            lVar20 = (ulong)(uint)fVar18 * uVar15 * 4;
            lVar13 = *(long *)(pfVar2 + 0x13b6);
            lVar3 = *(long *)(pfVar2 + 0x13b4);
            uVar19 = 0;
            do {
              fVar18 = inbuffer[uVar19];
              *(float *)(lVar20 + lVar3 + uVar19 * 4) = fVar18;
              dVar30 = *(double *)(pfVar2 + uVar19 * 2 + 0x18) * 0.9998999834060669 +
                       (double)ABS(fVar18);
              *(double *)(pfVar2 + uVar19 * 2 + 0x18) = dVar30;
              *(float *)(lVar13 + lVar20 + uVar19 * 4) = (float)dVar30;
              uVar19 = uVar19 + 1;
            } while (uVar15 != uVar19);
          }
        }
        uVar17 = uVar17 + 1;
        inbuffer = inbuffer + inchannels;
      } while (uVar17 != length);
    }
    memset(outbuffer,0,(ulong)(outchannels * length) << 2);
    uVar17 = (state->field_0).field_0.flags;
    if ((uVar17 & 6) == 0) {
      if ((uVar17 & 1) == 0) {
        lVar13 = 200;
        do {
          *(undefined4 *)((long)pfVar2 + lVar13) = 0x3f800000;
          lVar13 = lVar13 + 0x28;
        } while (lVar13 != 0x4ee8);
      }
      else {
        fVar22 = pfVar2[0x2a];
        debug_graincount = fVar22;
        if (length != 0) {
          fVar18 = pfVar2[7];
          fVar28 = pfVar2[8];
          fVar29 = pfVar2[0x29] * fVar28 + fVar18;
          uVar17 = -(uint)(0.0 < fVar29);
          fVar31 = (float)(~uVar17 & 0x4cbebc20 | (uint)(fVar27 / fVar29) & uVar17);
          fVar29 = pfVar2[0x28];
          uVar17 = 0;
          do {
            fVar29 = fVar29 + 1.0;
            if (fVar31 <= fVar29) {
              fVar29 = fVar29 - fVar31;
              fVar10 = (float)((int)pfVar2[0xd] * 0x19660d + 0x3c6ef35f);
              pfVar2[0xd] = fVar10;
              fVar31 = (float)((uint)fVar10 & 0xffffff ^ (uint)fVar10 >> 0x10) * 5.960465e-08 + 0.0;
              pfVar2[0x29] = fVar31;
              fVar31 = fVar31 * fVar28 + fVar18;
              uVar26 = -(uint)(0.0 < fVar31);
              fVar31 = (float)(~uVar26 & 0x4cbebc20 | (uint)(fVar27 / fVar31) & uVar26);
              if (((int)fVar22 < 500) && (fVar32 = pfVar25[4], fVar32 != 0.0)) {
                pfVar2[0x2a] = (float)((int)fVar22 + 1);
                uVar26 = (int)fVar10 * 0x19660d + 0x3c6ef35f;
                fVar10 = pfVar25[5];
                fVar34 = 0.0;
                if ((int)uVar14 < 0) {
                  fVar34 = (float)(int)pfVar2[0xe];
                }
                pfVar24 = pfVar2 + (long)(int)fVar22 * 10 + 0x2c;
                *(float **)pfVar24 = pfVar25;
                pfVar24[2] = (float)((uVar26 >> 0x10 ^ uVar26) % (uint)fVar10);
                pfVar24[4] = (float)(uVar14 >> 0x1f);
                fVar32 = (float)((int)fVar32 + -1);
                fVar10 = pfVar2[1];
                uVar16 = uVar26 * 0x19660d + 0x3c6ef35f;
                fVar33 = ((float)(uVar16 & 0xffffff ^ uVar16 >> 0x10) *
                          ((pfVar2[4] + fVar10) - fVar10) * 5.960465e-08 + fVar10) * fVar32;
                pfVar24[3] = (float)(int)fVar33;
                fVar10 = pfVar2[6] - pfVar2[3];
                uVar16 = uVar26 * 0x17385ca9 + 0x47502932;
                fVar10 = (float)(uVar16 & 0xffffff ^ uVar16 >> 0x10) * (pfVar2[6] - fVar10) *
                         5.960465e-08 + fVar10;
                pfVar24[5] = ((ABS(fVar10) - ABS(fVar10 + -1.0)) + 1.0) * 0.5 * fVar32 + fVar34;
                fVar10 = *pfVar2;
                uVar16 = uVar26 * -0x50b6f56b + 0xd1ccf6e9;
                fVar10 = (float)(uVar16 & 0xffffff ^ uVar16 >> 0x10) *
                         ((pfVar2[2] + fVar10) - fVar10) * 5.960465e-08 + fVar10;
                fVar10 = (float)(int)pfVar25[6] *
                         (ABS(0.001 - fVar10) + fVar10 + 0.001) * 0.5 * (1.0 / (float)(int)fVar33) *
                         (1.0 / fVar27);
                pfVar24[7] = fVar10;
                pfVar24[6] = -fVar10 * ((1.0 - fVar29) + (float)(int)uVar17);
                fVar10 = pfVar2[10];
                fVar32 = (float)(uVar26 * 0x979e791 + -0x5506accc);
                pfVar2[0xd] = fVar32;
                pfVar24[8] = ((float)((uint)fVar32 & 0xffffff ^ (uint)fVar32 >> 0x10) *
                              (fVar10 + fVar10) * 5.960465e-08 - fVar10) + pfVar2[9];
                pfVar24[9] = pfVar2[0xb];
                fVar22 = (float)((int)fVar22 + 1);
              }
            }
            uVar17 = uVar17 + 1;
          } while (length != uVar17);
          pfVar2[0x28] = fVar29;
        }
        pfVar25 = pfVar2 + (long)(int)fVar22 * 10 + 0x2c;
        if (0 < (int)fVar22) {
          pfVar24 = pfVar2 + 0x2c;
          do {
            if (length != 0) {
              plVar4 = *(long **)pfVar24;
              lVar13 = (long)(int)pfVar24[2] * 4 + *plVar4;
              fVar22 = pfVar24[3];
              iVar1 = (int)plVar4[2];
              pfVar23 = outbuffer + 1;
              uVar14 = length;
              do {
                fVar27 = pfVar24[6];
                fVar18 = (ABS(0.0 - fVar27) + fVar27 + 0.0) * 0.5;
                pfVar24[6] = fVar27 + pfVar24[7];
                fVar28 = (1.0 - ABS(fVar18 + fVar18 + -1.0)) * pfVar24[9];
                fVar27 = fVar18 * (float)(int)fVar22 + pfVar24[5];
                fVar18 = floorf(fVar27);
                iVar11 = (int)fVar18;
                if ((iVar11 < iVar1) || (iVar11 = iVar11 - iVar1, pfVar24[4] != 0.0)) {
                  fVar29 = ((ABS(fVar28) - ABS(fVar28 + -1.0)) + 1.0) * 0.5;
                  iVar12 = iVar11 + 1;
                  fVar28 = *(float *)(lVar13 + (long)(*(int *)((long)plVar4 + 0x14) * iVar11) * 4);
                  if ((iVar12 < iVar1) || (iVar12 = iVar12 - iVar1, pfVar24[4] != 0.0)) {
                    fVar29 = fVar29 * ((*(float *)(lVar13 + (long)(iVar12 * *(int *)((long)plVar4 +
                                                                                    0x14)) * 4) -
                                       fVar28) * (fVar27 - (float)(int)fVar18) + fVar28);
                  }
                  else {
                    fVar29 = fVar29 * fVar28;
                  }
                }
                else {
                  fVar29 = 0.0;
                }
                pfVar23[-1] = (1.0 - pfVar24[8]) * fVar29 + pfVar23[-1];
                *pfVar23 = fVar29 * pfVar24[8] + *pfVar23;
                pfVar23 = pfVar23 + outchannels;
                uVar14 = uVar14 - 1;
              } while (uVar14 != 0);
            }
            if (0.99999 <= pfVar24[6]) {
              *(undefined8 *)(pfVar24 + 8) = *(undefined8 *)(pfVar25 + -2);
              uVar6 = *(undefined8 *)(pfVar25 + -10);
              uVar7 = *(undefined8 *)(pfVar25 + -8);
              pfVar23 = pfVar25 + -6;
              uVar8 = *(undefined8 *)(pfVar25 + -4);
              pfVar25 = pfVar25 + -10;
              *(undefined8 *)(pfVar24 + 4) = *(undefined8 *)pfVar23;
              *(undefined8 *)(pfVar24 + 6) = uVar8;
              *(undefined8 *)pfVar24 = uVar6;
              *(undefined8 *)(pfVar24 + 2) = uVar7;
            }
            else {
              pfVar24 = pfVar24 + 10;
            }
          } while (pfVar24 < pfVar25);
        }
        pfVar2[0x2a] = (float)((int)((ulong)((long)pfVar25 - (long)(pfVar2 + 0x2c)) >> 3) *
                              -0x33333333);
      }
    }
    MutexScopeLock::~MutexScopeLock(&local_38);
    return 0;
  }
  __assert_fail("internal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                ,0xfe,"T *UnityAudioEffectState::GetEffectData() const [T = Granulator::EffectData]"
               );
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData* data = state->GetEffectData<EffectData>();

        const int samplerate = state->samplerate;
        const float sampletime = 1.0f / (float)samplerate;
        const float freeze = data->p[P_FREEZE] * 2.0f;
        const int usesample = (int)data->p[P_USESAMPLE];
        const float* params = data->p;

        MutexScopeLock mutexScope(Granulator::sampleMutex, usesample >= 0);

        data->delay.numchannels = inchannels;

        GranulatorSample* gs = (usesample >= 0) ? &GetGranulatorSample(usesample) : &data->delay;

        // Fill in live data
        const float* src = inbuffer;
        for (int n = 0; n < length; n++)
        {
            bool record = false;
            for (int i = 0; i < inchannels; i++)
            {
                float input = src[i];
                float a = fabsf(input) + 1.0e-11f;
                data->env[i] = (a > data->env[i]) ? a : (data->env[i] * 0.9995f);
                record |= (data->env[i] > freeze);
            }
            if (record)
            {
                data->delaypos = (data->delaypos + MAXDELAYLENGTH - 1) & (MAXDELAYLENGTH - 1);
                for (int i = 0; i < inchannels; i++)
                {
                    data->delay.data[data->delaypos * inchannels + i] = src[i];

                    // Calculate integrated signal on the fly for better reconstruction in GetFloatBufferCallback.
                    // The small leak of 0.1% prevents build-up of DC.
                    data->integrator[i] = data->integrator[i] * 0.9999f + fabsf(src[i]);
                    data->delay.preview[data->delaypos * inchannels + i] = data->integrator[i];
                }
            }
            src += inchannels;
        }

        memset(outbuffer, 0, length * outchannels * sizeof(float));

        if (state->flags & (UnityAudioEffectStateFlags_IsMuted | UnityAudioEffectStateFlags_IsPaused))
            return UNITY_AUDIODSP_OK;

        if ((state->flags & UnityAudioEffectStateFlags_IsPlaying) == 0)
        {
            ResetGrains(data);
            return UNITY_AUDIODSP_OK;
        }

        debug_graincount = data->activegrains;

        // Fill in new grains
        float rate = data->p[P_RATE] + data->p[P_RRATE] * data->nextrandtime;
        float nexteventsample = (rate > 0.0f) ? (samplerate / rate) : 100000000;
        for (int n = 0; n < length; n++)
        {
            if (++data->samplecounter >= nexteventsample)
            {
                data->samplecounter -= nexteventsample;
                float fracpos = 1.0f - data->samplecounter;
                data->nextrandtime = data->random.GetFloat(0.0f, 1.0f);
                rate = data->p[P_RATE] + data->p[P_RRATE] * data->nextrandtime;
                nexteventsample = (rate > 0.0f) ? (samplerate / rate) : 100000000;
                if (data->activegrains >= MAXGRAINS || gs->numsamples == 0)
                    continue;
                data->grains[data->activegrains++].Setup(
                    gs,
                    data->random.Get() % gs->numchannels,
                    data->random,
                    sampletime,
                    (usesample >= 0) ? 0 : data->delaypos,
                    params,
                    n + fracpos,
                    usesample < 0
                    );
            }
        }

        // Process grains
        Grain* g = data->grains;
        Grain* g_end = data->grains + data->activegrains;
        while (g < g_end)
        {
            float* dst = outbuffer;
            for (int n = 0; n < length; n++)
            {
                float s = g->Scan();
                dst[0] += s * (1.0f - g->pan);
                dst[1] += s * g->pan;
                dst += outchannels;
            }
            if (g->pos >= 0.99999f)
                *g = *(--g_end);
            else
                ++g;
        }
        data->activegrains = g_end - data->grains;

        return UNITY_AUDIODSP_OK;
    }